

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  byte *pbVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar xVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int max;
  xmlURIPtr local_40;
  long local_38;
  
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  max = 0x50;
  pxVar6 = (xmlChar *)(*xmlMallocAtomic)(0x51);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlURIErrMemory("saving URI\n");
    return (xmlChar *)0x0;
  }
  pcVar3 = uri->scheme;
  local_40 = uri;
  if (pcVar3 == (char *)0x0) {
    iVar16 = 0;
  }
  else {
    for (uVar18 = 0; xVar10 = pcVar3[uVar18], xVar10 != '\0'; uVar18 = uVar18 + 1) {
      pxVar7 = pxVar6;
      if ((long)max <= (long)uVar18) {
        pxVar7 = xmlSaveUriRealloc(pxVar6,&max);
        if (pxVar7 == (xmlChar *)0x0) goto LAB_00186f65;
        xVar10 = pcVar3[uVar18];
      }
      pxVar7[uVar18] = xVar10;
      pxVar6 = pxVar7;
    }
    pxVar7 = pxVar6;
    if ((max <= (int)uVar18) && (pxVar7 = xmlSaveUriRealloc(pxVar6,&max), pxVar7 == (xmlChar *)0x0))
    goto LAB_00186f65;
    iVar16 = (int)uVar18 + 1;
    pxVar7[uVar18 & 0xffffffff] = ':';
    pxVar6 = pxVar7;
  }
  pbVar15 = (byte *)local_40->opaque;
  pxVar7 = pxVar6;
  if (pbVar15 == (byte *)0x0) {
    if ((local_40->server == (char *)0x0) && (local_40->port != -1)) {
      if (local_40->authority == (char *)0x0) {
        if (((local_40->scheme != (char *)0x0) && (max <= iVar16 + 3)) &&
           (pxVar7 = xmlSaveUriRealloc(pxVar6,&max), pxVar7 == (xmlChar *)0x0)) goto LAB_00186f65;
      }
      else {
        if ((max <= iVar16 + 3) &&
           (pxVar7 = xmlSaveUriRealloc(pxVar6,&max), pxVar7 == (xmlChar *)0x0)) goto LAB_00186f65;
        (pxVar7 + iVar16)[0] = '/';
        (pxVar7 + iVar16)[1] = '/';
        pxVar6 = pxVar7;
        iVar16 = iVar16 + 2;
        for (pbVar15 = (byte *)local_40->authority; bVar11 = *pbVar15, pxVar7 = pxVar6, bVar11 != 0;
            pbVar15 = pbVar15 + 1) {
          iVar5 = iVar16 + 3;
          if (max <= iVar5) {
            pxVar7 = xmlSaveUriRealloc(pxVar6,&max);
            if (pxVar7 == (xmlChar *)0x0) goto LAB_00186f65;
            bVar11 = *pbVar15;
          }
          if (((((byte)(bVar11 - 0x30) < 10) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar11 - 0x21 < 0x3f &&
               ((0x4000000096003fe9U >> ((ulong)(bVar11 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar11 == 0x7e)) {
            iVar5 = iVar16 + 1;
            iVar17 = iVar16;
          }
          else {
            pxVar7[iVar16] = '%';
            cVar4 = '0';
            if (0x9f < bVar11) {
              cVar4 = '7';
            }
            iVar17 = iVar16 + 2;
            pxVar7[(long)iVar16 + 1] = cVar4 + (bVar11 >> 4);
            cVar4 = '0';
            if (9 < (bVar11 & 0xf)) {
              cVar4 = '7';
            }
            bVar11 = cVar4 + (bVar11 & 0xf);
          }
          pxVar7[iVar17] = bVar11;
          pxVar6 = pxVar7;
          iVar16 = iVar5;
        }
      }
    }
    else {
      if ((max <= iVar16 + 3) && (pxVar7 = xmlSaveUriRealloc(pxVar6,&max), pxVar7 == (xmlChar *)0x0)
         ) goto LAB_00186f65;
      (pxVar7 + iVar16)[0] = '/';
      (pxVar7 + iVar16)[1] = '/';
      iVar16 = iVar16 + 2;
      pbVar15 = (byte *)local_40->user;
      if (pbVar15 != (byte *)0x0) {
        pxVar6 = pxVar7;
        iVar5 = iVar16;
        while( true ) {
          bVar11 = *pbVar15;
          iVar16 = iVar5 + 3;
          if (bVar11 == 0) break;
          pxVar7 = pxVar6;
          if (max <= iVar16) {
            pxVar7 = xmlSaveUriRealloc(pxVar6,&max);
            if (pxVar7 == (xmlChar *)0x0) goto LAB_00186f65;
            bVar11 = *pbVar15;
          }
          if (((((byte)(bVar11 - 0x30) < 10) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar11 - 0x21 < 0x3f &&
               ((0x4000000016003fe9U >> ((ulong)(bVar11 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar11 == 0x7e)) {
            iVar16 = iVar5 + 1;
            iVar17 = iVar5;
          }
          else {
            pxVar7[iVar5] = '%';
            cVar4 = '0';
            if (0x9f < bVar11) {
              cVar4 = '7';
            }
            iVar17 = iVar5 + 2;
            pxVar7[(long)iVar5 + 1] = cVar4 + (bVar11 >> 4);
            cVar4 = '0';
            if (9 < (bVar11 & 0xf)) {
              cVar4 = '7';
            }
            bVar11 = cVar4 + (bVar11 & 0xf);
          }
          pxVar7[iVar17] = bVar11;
          pbVar15 = pbVar15 + 1;
          pxVar6 = pxVar7;
          iVar5 = iVar16;
        }
        pxVar7 = pxVar6;
        if ((max <= iVar16) && (pxVar7 = xmlSaveUriRealloc(pxVar6,&max), pxVar7 == (xmlChar *)0x0))
        goto LAB_00186f65;
        iVar16 = iVar5 + 1;
        pxVar7[iVar5] = '@';
      }
      pcVar3 = local_40->server;
      if (pcVar3 != (char *)0x0) {
        lVar14 = (long)iVar16;
        lVar12 = lVar14 << 0x20;
        local_38 = lVar14;
        for (lVar13 = 0; xVar10 = pcVar3[lVar13], pxVar6 = pxVar7, xVar10 != '\0';
            lVar13 = lVar13 + 1) {
          if ((long)max <= lVar14 + lVar13) {
            pxVar7 = xmlSaveUriRealloc(pxVar7,&max);
            if (pxVar7 == (xmlChar *)0x0) goto LAB_00186f65;
            xVar10 = pcVar3[lVar13];
            lVar14 = local_38;
          }
          pxVar7[lVar13 + lVar14] = xVar10;
          lVar12 = lVar12 + 0x100000000;
        }
        uVar2 = local_40->port;
        iVar5 = (int)lVar13;
        if ((int)uVar2 < 1) {
          iVar16 = iVar16 + iVar5;
        }
        else {
          if (max <= iVar16 + 10 + iVar5) {
            pxVar7 = xmlSaveUriRealloc(pxVar7,&max);
            if (pxVar7 == (xmlChar *)0x0) goto LAB_00186f65;
            uVar2 = local_40->port;
          }
          iVar17 = snprintf((char *)(pxVar7 + (lVar12 >> 0x20)),(long)((max - iVar16) - iVar5),":%d"
                            ,(ulong)uVar2);
          iVar16 = iVar16 + iVar5 + iVar17;
        }
      }
    }
    pbVar15 = (byte *)local_40->path;
    if (pbVar15 != (byte *)0x0) {
      if ((((xmlChar *)local_40->scheme != (xmlChar *)0x0) && (*pbVar15 == 0x2f)) &&
         (((byte)((pbVar15[1] & 0xdf) + 0xbf) < 0x1a &&
          ((pbVar15[2] == 0x3a &&
           (iVar5 = xmlStrEqual((xmlChar *)local_40->scheme,"file"), iVar5 != 0)))))) {
        pxVar8 = pxVar7;
        if ((max <= iVar16 + 3) &&
           (pxVar8 = xmlSaveUriRealloc(pxVar7,&max), pxVar6 = pxVar7, pxVar8 == (xmlChar *)0x0))
        goto LAB_00186f65;
        pxVar8[iVar16] = *pbVar15;
        pxVar8[(long)iVar16 + 1] = pbVar15[1];
        pbVar1 = pbVar15 + 2;
        pbVar15 = pbVar15 + 3;
        pxVar8[(long)iVar16 + 2] = *pbVar1;
        pxVar7 = pxVar8;
        iVar16 = iVar16 + 3;
      }
      for (; bVar11 = *pbVar15, bVar11 != 0; pbVar15 = pbVar15 + 1) {
        iVar5 = iVar16 + 3;
        pxVar8 = pxVar7;
        if (max <= iVar5) {
          pxVar8 = xmlSaveUriRealloc(pxVar7,&max);
          pxVar6 = pxVar7;
          if (pxVar8 == (xmlChar *)0x0) goto LAB_00186f65;
          bVar11 = *pbVar15;
        }
        if (((((byte)(bVar11 - 0x30) < 10) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) ||
            ((bVar11 - 0x21 < 0x3f &&
             ((0x4000000094007fe9U >> ((ulong)(bVar11 - 0x21) & 0x3f) & 1) != 0)))) ||
           (bVar11 == 0x7e)) {
          iVar5 = iVar16 + 1;
          iVar17 = iVar16;
        }
        else {
          pxVar8[iVar16] = '%';
          cVar4 = '0';
          if (0x9f < bVar11) {
            cVar4 = '7';
          }
          iVar17 = iVar16 + 2;
          pxVar8[(long)iVar16 + 1] = cVar4 + (bVar11 >> 4);
          cVar4 = '0';
          if (9 < (bVar11 & 0xf)) {
            cVar4 = '7';
          }
          bVar11 = cVar4 + (bVar11 & 0xf);
        }
        pxVar8[iVar17] = bVar11;
        pxVar7 = pxVar8;
        iVar16 = iVar5;
      }
    }
    pxVar6 = pxVar7;
    if (local_40->query_raw == (char *)0x0) {
      iVar5 = iVar16;
      if (local_40->query != (char *)0x0) {
        if ((max <= iVar16 + 3) &&
           (pxVar7 = xmlSaveUriRealloc(pxVar7,&max), pxVar7 == (xmlChar *)0x0)) goto LAB_00186f65;
        pxVar7[iVar16] = '?';
        iVar5 = iVar16 + 1;
        for (pbVar15 = (byte *)local_40->query; bVar11 = *pbVar15, bVar11 != 0;
            pbVar15 = pbVar15 + 1) {
          iVar16 = iVar5 + 3;
          pxVar8 = pxVar7;
          if (max <= iVar16) {
            pxVar8 = xmlSaveUriRealloc(pxVar7,&max);
            pxVar6 = pxVar7;
            if (pxVar8 == (xmlChar *)0x0) goto LAB_00186f65;
            bVar11 = *pbVar15;
          }
          if (((((byte)(bVar11 - 0x30) < 10) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar11 - 0x21 < 0x3f &&
               ((0x54000000d6007fe9U >> ((ulong)(bVar11 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar11 == 0x7e)) {
            iVar16 = iVar5 + 1;
            iVar17 = iVar5;
          }
          else {
            pxVar8[iVar5] = '%';
            cVar4 = '0';
            if (0x9f < bVar11) {
              cVar4 = '7';
            }
            iVar17 = iVar5 + 2;
            pxVar8[(long)iVar5 + 1] = cVar4 + (bVar11 >> 4);
            cVar4 = '0';
            if (9 < (bVar11 & 0xf)) {
              cVar4 = '7';
            }
            bVar11 = cVar4 + (bVar11 & 0xf);
          }
          pxVar8[iVar17] = bVar11;
          pxVar7 = pxVar8;
          iVar5 = iVar16;
        }
      }
    }
    else {
      iVar5 = iVar16 + 1;
      if ((max <= iVar5) && (pxVar7 = xmlSaveUriRealloc(pxVar7,&max), pxVar7 == (xmlChar *)0x0))
      goto LAB_00186f65;
      pxVar7[iVar16] = '?';
      pxVar8 = (xmlChar *)local_40->query_raw;
      lVar14 = (long)iVar5;
      while( true ) {
        xVar10 = *pxVar8;
        if (xVar10 == '\0') break;
        pxVar9 = pxVar7;
        if ((long)max <= lVar14 + 1) {
          pxVar9 = xmlSaveUriRealloc(pxVar7,&max);
          pxVar6 = pxVar7;
          if (pxVar9 == (xmlChar *)0x0) goto LAB_00186f65;
          xVar10 = *pxVar8;
        }
        pxVar8 = pxVar8 + 1;
        pxVar9[lVar14] = xVar10;
        iVar5 = iVar5 + 1;
        pxVar7 = pxVar9;
        lVar14 = lVar14 + 1;
      }
    }
  }
  else {
    iVar5 = iVar16;
    for (; bVar11 = *pbVar15, bVar11 != 0; pbVar15 = pbVar15 + 1) {
      iVar16 = iVar5 + 3;
      pxVar8 = pxVar7;
      if (max <= iVar16) {
        pxVar8 = xmlSaveUriRealloc(pxVar7,&max);
        pxVar6 = pxVar7;
        if (pxVar8 == (xmlChar *)0x0) goto LAB_00186f65;
        bVar11 = *pbVar15;
      }
      if (((((bVar11 - 0x24 < 0x3a) &&
            ((0x28000001ac00985U >> ((ulong)(bVar11 - 0x24) & 0x3f) & 1) != 0)) ||
           ((byte)(bVar11 - 0x30) < 10)) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) ||
         (((bVar11 - 0x21 < 0x3f &&
           ((0x40000000000033c1U >> ((ulong)(bVar11 - 0x21) & 0x3f) & 1) != 0)) || (bVar11 == 0x7e))
         )) {
        iVar16 = iVar5 + 1;
        iVar17 = iVar5;
      }
      else {
        pxVar8[iVar5] = '%';
        cVar4 = '0';
        if (0x9f < bVar11) {
          cVar4 = '7';
        }
        iVar17 = iVar5 + 2;
        pxVar8[(long)iVar5 + 1] = cVar4 + (bVar11 >> 4);
        cVar4 = '0';
        if (9 < (bVar11 & 0xf)) {
          cVar4 = '7';
        }
        bVar11 = cVar4 + (bVar11 & 0xf);
      }
      pxVar8[iVar17] = bVar11;
      pxVar7 = pxVar8;
      iVar5 = iVar16;
    }
  }
  if (local_40->fragment != (char *)0x0) {
    pxVar8 = pxVar7;
    if ((max <= iVar5 + 3) &&
       (pxVar8 = xmlSaveUriRealloc(pxVar7,&max), pxVar6 = pxVar7, pxVar8 == (xmlChar *)0x0))
    goto LAB_00186f65;
    pxVar8[iVar5] = '#';
    pxVar7 = pxVar8;
    iVar5 = iVar5 + 1;
    for (pbVar15 = (byte *)local_40->fragment; bVar11 = *pbVar15, bVar11 != 0; pbVar15 = pbVar15 + 1
        ) {
      iVar16 = iVar5 + 3;
      pxVar8 = pxVar7;
      if (max <= iVar16) {
        pxVar8 = xmlSaveUriRealloc(pxVar7,&max);
        pxVar6 = pxVar7;
        if (pxVar8 == (xmlChar *)0x0) goto LAB_00186f65;
        bVar11 = *pbVar15;
      }
      if (((((byte)(bVar11 - 0x30) < 10) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) ||
          ((bVar11 - 0x21 < 0x3f &&
           ((0x54000000d6007fe9U >> ((ulong)(bVar11 - 0x21) & 0x3f) & 1) != 0)))) ||
         (bVar11 == 0x7e)) {
        iVar16 = iVar5 + 1;
        iVar17 = iVar5;
      }
      else {
        pxVar8[iVar5] = '%';
        cVar4 = '0';
        if (0x9f < bVar11) {
          cVar4 = '7';
        }
        iVar17 = iVar5 + 2;
        pxVar8[(long)iVar5 + 1] = cVar4 + (bVar11 >> 4);
        cVar4 = '0';
        if (9 < (bVar11 & 0xf)) {
          cVar4 = '7';
        }
        bVar11 = cVar4 + (bVar11 & 0xf);
      }
      pxVar8[iVar17] = bVar11;
      pxVar7 = pxVar8;
      iVar5 = iVar16;
    }
  }
  pxVar8 = pxVar7;
  if ((iVar5 < max) ||
     (pxVar8 = xmlSaveUriRealloc(pxVar7,&max), pxVar6 = pxVar7, pxVar8 != (xmlChar *)0x0)) {
    pxVar8[iVar5] = '\0';
    return pxVar8;
  }
LAB_00186f65:
  (*xmlFree)(pxVar6);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = (xmlChar *) xmlMallocAtomic(max + 1);
    if (ret == NULL) {
        xmlURIErrMemory("saving URI\n");
	return(NULL);
    }
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port == -1)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
		    ret[len++] = *p++;
		}
		if (uri->port > 0) {
		    if (len + 10 >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
		    len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
		}
	    }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}